

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcBoxedHalfSpace::~IfcBoxedHalfSpace(IfcBoxedHalfSpace *this)

{
  _func_int *p_Var1;
  
  p_Var1 = (_func_int *)
           ((long)&(this->super_IfcHalfSpaceSolid).super_IfcGeometricRepresentationItem.
                   super_IfcRepresentationItem.
                   super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                   _vptr_ObjectHelper +
           (long)(this->super_IfcHalfSpaceSolid).super_IfcGeometricRepresentationItem.
                 super_IfcRepresentationItem.
                 super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                 _vptr_ObjectHelper[-3]);
  *(undefined8 *)p_Var1 = 0x96d200;
  *(undefined8 *)(p_Var1 + 0x70) = 0x96d278;
  *(undefined8 *)(p_Var1 + 0x10) = 0x96d228;
  *(undefined8 *)(p_Var1 + 0x20) = 0x96d250;
  if (*(code **)(p_Var1 + 0x38) != p_Var1 + 0x48) {
    operator_delete(*(code **)(p_Var1 + 0x38),*(long *)(p_Var1 + 0x48) + 1);
    return;
  }
  return;
}

Assistant:

IfcBoxedHalfSpace() : Object("IfcBoxedHalfSpace") {}